

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O0

size_t __thiscall
DisconnectedBlockTransactions::DynamicMemoryUsage(DisconnectedBlockTransactions *this)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
  *m;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  m = (unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
       *)*in_RDI;
  sVar2 = memusage::
          DynamicUsage<uint256,std::_List_iterator<std::shared_ptr<CTransaction_const>>,SaltedTxidHasher>
                    (m);
  sVar3 = memusage::DynamicUsage<std::shared_ptr<CTransaction_const>>
                    ((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)m);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (long)&(m->_M_h).
                  super__Hashtable_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  .
                  super__Hash_code_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                  .super__Hashtable_ebo_helper<1,_SaltedTxidHasher,_false>._M_tp.k0 + sVar3 + sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t DisconnectedBlockTransactions::DynamicMemoryUsage() const
{
    return cachedInnerUsage + memusage::DynamicUsage(iters_by_txid) + memusage::DynamicUsage(queuedTx);
}